

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_write_attributes_uint64(void *a,uint64_t *attrib,uint32_t nr_of_attribs)

{
  int iVar1;
  uint uVar2;
  char *dst;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint64_t sz;
  uint8_t *b5;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  uint8_t *b8;
  uint8_t *b7;
  uint8_t *b6;
  LZ4_stream_t lz4Stream_body;
  
  iVar1 = buffer_ready_for_writing((trico_archive *)a,1);
  iVar3 = 0;
  if (iVar1 != 0) {
    **(undefined1 **)((long)a + 8) = 0x14;
    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 1;
    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -1;
    iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
    iVar3 = 0;
    if (iVar1 != 0) {
      **(uint32_t **)((long)a + 8) = nr_of_attribs;
      *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
      uVar5 = (ulong)nr_of_attribs;
      b1 = (uint8_t *)malloc(uVar5);
      b2 = (uint8_t *)malloc(uVar5);
      b3 = (uint8_t *)malloc(uVar5);
      b4 = (uint8_t *)malloc(uVar5);
      b5 = (uint8_t *)malloc(uVar5);
      b6 = (uint8_t *)malloc(uVar5);
      b7 = (uint8_t *)malloc(uVar5);
      b8 = (uint8_t *)malloc(uVar5);
      trico_transpose_uint64_aos_to_soa(&b1,&b2,&b3,&b4,&b5,&b6,&b7,&b8,attrib,nr_of_attribs);
      LZ4_initStream(&lz4Stream_body,0x4020);
      iVar3 = 0;
      uVar4 = 0;
      if (nr_of_attribs < 0x7e000001) {
        uVar4 = (uint)(uVar5 * 0x8080808081 >> 0x27) + 0x10;
      }
      dst = (char *)malloc((ulong)uVar4);
      uVar2 = LZ4_compress_default((char *)b1,dst,nr_of_attribs,uVar4);
      iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
      if (iVar1 != 0) {
        **(uint **)((long)a + 8) = uVar2;
        *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
        *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
        uVar5 = (ulong)uVar2;
        iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
        if (iVar1 != 0) {
          memcpy(*(void **)((long)a + 8),dst,uVar5);
          *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
          *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
          uVar2 = LZ4_compress_default((char *)b2,dst,nr_of_attribs,uVar4);
          iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
          if (iVar1 != 0) {
            **(uint **)((long)a + 8) = uVar2;
            *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
            *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
            uVar5 = (ulong)uVar2;
            iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
            if (iVar1 != 0) {
              memcpy(*(void **)((long)a + 8),dst,uVar5);
              *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
              *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
              uVar2 = LZ4_compress_default((char *)b3,dst,nr_of_attribs,uVar4);
              iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
              if (iVar1 != 0) {
                **(uint **)((long)a + 8) = uVar2;
                *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                uVar5 = (ulong)uVar2;
                iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
                if (iVar1 != 0) {
                  memcpy(*(void **)((long)a + 8),dst,uVar5);
                  *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
                  *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
                  uVar2 = LZ4_compress_default((char *)b4,dst,nr_of_attribs,uVar4);
                  iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
                  if (iVar1 != 0) {
                    **(uint **)((long)a + 8) = uVar2;
                    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                    uVar5 = (ulong)uVar2;
                    iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
                    if (iVar1 != 0) {
                      memcpy(*(void **)((long)a + 8),dst,uVar5);
                      *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
                      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
                      uVar2 = LZ4_compress_default((char *)b5,dst,nr_of_attribs,uVar4);
                      iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
                      if (iVar1 != 0) {
                        **(uint **)((long)a + 8) = uVar2;
                        *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                        *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                        uVar5 = (ulong)uVar2;
                        iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
                        if (iVar1 != 0) {
                          memcpy(*(void **)((long)a + 8),dst,uVar5);
                          *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
                          *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
                          uVar2 = LZ4_compress_default((char *)b6,dst,nr_of_attribs,uVar4);
                          iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
                          if (iVar1 != 0) {
                            **(uint **)((long)a + 8) = uVar2;
                            *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                            *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                            uVar5 = (ulong)uVar2;
                            iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
                            if (iVar1 != 0) {
                              memcpy(*(void **)((long)a + 8),dst,uVar5);
                              *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
                              *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
                              uVar2 = LZ4_compress_default((char *)b7,dst,nr_of_attribs,uVar4);
                              iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
                              if (iVar1 != 0) {
                                **(uint **)((long)a + 8) = uVar2;
                                *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                                *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                                uVar5 = (ulong)uVar2;
                                iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
                                if (iVar1 != 0) {
                                  memcpy(*(void **)((long)a + 8),dst,uVar5);
                                  *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
                                  *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
                                  uVar4 = LZ4_compress_default((char *)b8,dst,nr_of_attribs,uVar4);
                                  iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
                                  if (iVar1 != 0) {
                                    **(uint **)((long)a + 8) = uVar4;
                                    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
                                    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
                                    uVar5 = (ulong)uVar4;
                                    iVar1 = buffer_ready_for_writing((trico_archive *)a,uVar5);
                                    if (iVar1 != 0) {
                                      memcpy(*(void **)((long)a + 8),dst,uVar5);
                                      *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar5;
                                      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar5;
                                      free(dst);
                                      free(b1);
                                      free(b2);
                                      free(b3);
                                      free(b4);
                                      free(b5);
                                      free(b6);
                                      free(b7);
                                      free(b8);
                                      iVar3 = 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int trico_write_attributes_uint64(void* a, const uint64_t* attrib, uint32_t nr_of_attribs)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_attribute_uint64_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b5 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b6 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b7 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b8 = (uint8_t*)trico_malloc(nr_of_attribs);

  trico_transpose_uint64_aos_to_soa(&b1, &b2, &b3, &b4, &b5, &b6, &b7, &b8, attrib, nr_of_attribs);


  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_attribs);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b5, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b6, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b7, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b8, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);
  trico_free(b5);
  trico_free(b6);
  trico_free(b7);
  trico_free(b8);

  return 1;
  }